

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,SkelAnimation *skelanim,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  tinyusdz *ptVar3;
  uint32_t indent_00;
  string *psVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  undefined3 in_register_00000081;
  uint32_t indent_01;
  string local_458;
  string local_438;
  allocator local_411;
  undefined1 local_410 [32];
  string local_3f0;
  allocator local_3c9;
  undefined1 local_3c8 [32];
  string local_3a8;
  allocator local_381;
  undefined1 local_380 [32];
  string local_360;
  allocator local_339;
  undefined1 local_338 [32];
  string local_318;
  allocator local_2f1;
  undefined1 local_2f0 [32];
  string local_2d0;
  allocator local_2a9;
  undefined1 local_2a8 [32];
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  SkelAnimation *skelanim_local;
  
  indent_01 = CONCAT31(in_register_00000081,closing_brace);
  local_1c = (uint)skelanim;
  local_1d = (byte)indent & 1;
  psVar4 = __return_storage_ptr__;
  ptStack_18 = this;
  skelanim_local = (SkelAnimation *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar4;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*(uint *)(ptStack_18 + 0x20),s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2," SkelAnimation \"");
  poVar2 = ::std::operator<<(poVar2,(string *)ptStack_18);
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored((PrimMetas *)((string *)ptStack_18 + 0xf50));
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)((string *)ptStack_18 + 0xf50),
               (PrimMeta *)(ulong)(local_1c + 1),indent_00);
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,n_02);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string((string *)&local_268);
  ptVar3 = (tinyusdz *)((string *)ptStack_18 + 0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2a8,"blendShapes",&local_2a9);
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            ((string *)(local_2a8 + 0x20),ptVar3,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_2a8,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_2a8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2a8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  ptVar3 = (tinyusdz *)((string *)ptStack_18 + 0x280);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2f0,"blendShapeWeights",&local_2f1);
  print_typed_attr<std::vector<float,std::allocator<float>>>
            ((string *)(local_2f0 + 0x20),ptVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             local_2f0,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_2f0 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2f0 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  ptVar3 = (tinyusdz *)((string *)ptStack_18 + 0x4f8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_338,"joints",&local_339);
  print_typed_attr<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            ((string *)(local_338 + 0x20),ptVar3,
             (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
             local_338,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_338 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_338 + 0x20));
  ::std::__cxx11::string::~string((string *)local_338);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
  ptVar3 = (tinyusdz *)((string *)ptStack_18 + 0x748);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_380,"rotations",&local_381);
  print_typed_attr<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
            ((string *)(local_380 + 0x20),ptVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
              *)local_380,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_380 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_380 + 0x20));
  ::std::__cxx11::string::~string((string *)local_380);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
  ptVar3 = (tinyusdz *)((string *)ptStack_18 + 0x9c0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_3c8,"scales",&local_3c9);
  print_typed_attr<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
            ((string *)(local_3c8 + 0x20),ptVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
              *)local_3c8,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_3c8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_3c8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_3c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  ptVar3 = (tinyusdz *)((string *)ptStack_18 + 0xc38);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_410,"translations",&local_411);
  print_typed_attr<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
            ((string *)(local_410 + 0x20),ptVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              *)local_410,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_410 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_410 + 0x20));
  ::std::__cxx11::string::~string((string *)local_410);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_411);
  print_props(&local_438,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)((string *)ptStack_18 + 0xf20),local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_438);
  ::std::__cxx11::string::~string((string *)&local_438);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_458,(pprint *)(ulong)local_1c,n_03);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_458);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_458);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const SkelAnimation &skelanim, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(skelanim.spec)
     << " SkelAnimation \"" << skelanim.name << "\"\n";
  if (skelanim.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(skelanim.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_attr(skelanim.blendShapes, "blendShapes", indent + 1);
  ss << print_typed_attr(skelanim.blendShapeWeights, "blendShapeWeights",
                         indent + 1);
  ss << print_typed_attr(skelanim.joints, "joints", indent + 1);
  ss << print_typed_attr(skelanim.rotations, "rotations", indent + 1);
  ss << print_typed_attr(skelanim.scales, "scales", indent + 1);
  ss << print_typed_attr(skelanim.translations, "translations", indent + 1);

  ss << print_props(skelanim.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}